

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O3

int __thiscall QFile::link(QFile *this,char *__from,char *__to)

{
  QFileDevicePrivate *this_00;
  int iVar1;
  undefined4 extraout_var;
  QFile *__to_00;
  QArrayData *__from_00;
  long in_FS_OFFSET;
  QFileInfo fi;
  QFileInfo local_50;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFileDevicePrivate *)(this->super_QFileDevice).super_QIODevice.super_QObject.d_ptr.d;
  __from_00 = (QArrayData *)&local_48;
  __to_00 = this;
  (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0x1d])();
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      __to_00 = (QFile *)0x2;
      __from_00 = &(local_48.d.d)->super_QArrayData;
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (local_48.d.size == 0) {
    link((char *)__from_00,(char *)__to_00);
    iVar1 = 0;
  }
  else {
    local_50.d_ptr.d.ptr = (QSharedDataPointer<QFileInfoPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QFileInfo::QFileInfo(&local_50,(QString *)__from);
    iVar1 = (*(this_00->super_QIODevicePrivate).super_QObjectPrivate.super_QObjectData.
              _vptr_QObjectData[7])(this_00);
    QFileInfo::absoluteFilePath(&local_48,&local_50);
    iVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x70))
                      ((long *)CONCAT44(extraout_var,iVar1),&local_48);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((char)iVar1 == '\0') {
      QAbstractFileEngine::errorString
                (&local_48,
                 (QAbstractFileEngine *)
                 (this_00->fileEngine)._M_t.
                 super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
                 .super__Head_base<0UL,_QAbstractFileEngine_*,_false>);
      QFileDevicePrivate::setError(this_00,RenameError,&local_48);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      QFileDevice::unsetError(&this->super_QFileDevice);
    }
    QFileInfo::~QFileInfo(&local_50);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool
QFile::link(const QString &linkName)
{
    Q_D(QFile);
    if (fileName().isEmpty()) {
        qWarning("QFile::link: Empty or null file name");
        return false;
    }
    QFileInfo fi(linkName);
    if (d->engine()->link(fi.absoluteFilePath())) {
        unsetError();
        return true;
    }
    d->setError(QFile::RenameError, d->fileEngine->errorString());
    return false;
}